

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  endpoint_indices_details *peVar5;
  uint *puVar6;
  unpacked_endpoint *puVar7;
  optimize_color_params *poVar8;
  uint i_00;
  result *local_278;
  result *local_220;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1fc;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_1d4;
  uint local_160;
  uint local_15c;
  uint i_4;
  uint best_bits;
  optimize_color_params *pParams;
  float fStack_138;
  uint i_3;
  float weights [4];
  result remapping_trial [4];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_7c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_78;
  ushort local_72;
  undefined1 local_70 [6];
  uint16 i_2;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  uint local_58;
  uint16 i_1;
  uint best_sum;
  uint uStack_4c;
  uint16 selected;
  uint b;
  uint i_prev;
  uint i;
  undefined1 local_38 [8];
  vector<unsigned_int> sum;
  vector<unsigned_int> hist;
  uint16 n;
  crn_comp *this_local;
  
  uVar3 = vector<unsigned_int>::size(&this->m_color_endpoints);
  uVar2 = (ushort)uVar3;
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)&sum.m_size,(uVar3 & 0xffff) * (uVar3 & 0xffff));
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_38,uVar3 & 0xffff);
  uStack_4c = 0;
  best_sum = 0;
  while( true ) {
    uVar4 = vector<crnlib::dxt_hc::endpoint_indices_details>::size(&this->m_endpoint_indices);
    if (uVar4 <= best_sum) break;
    peVar5 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                       (&this->m_endpoint_indices,best_sum);
    i_00 = (uint)(peVar5->field_0).field_0.color;
    if (((this->m_has_subblocks & 1U) == 0) || ((best_sum & 1) == 0)) {
      peVar5 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         (&this->m_endpoint_indices,best_sum);
      bVar1 = (peVar5->reference != '\0' ^ 0xffU) & 1;
    }
    else {
      peVar5 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         (&this->m_endpoint_indices,best_sum);
      bVar1 = peVar5->reference;
    }
    if ((bVar1 != 0) && (i_00 != uStack_4c)) {
      puVar6 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)&sum.m_size,i_00 * (uVar3 & 0xffff) + uStack_4c);
      *puVar6 = *puVar6 + 1;
      puVar6 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)&sum.m_size,uStack_4c * (uVar3 & 0xffff) + i_00);
      *puVar6 = *puVar6 + 1;
      puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,i_00);
      *puVar6 = *puVar6 + 1;
      puVar6 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_38,uStack_4c);
      *puVar6 = *puVar6 + 1;
    }
    best_sum = best_sum + 1;
    uStack_4c = i_00;
  }
  i_1 = 0;
  local_58 = 0;
  for (unpacked_endpoints.m_capacity._2_2_ = 0; unpacked_endpoints.m_capacity._2_2_ < uVar2;
      unpacked_endpoints.m_capacity._2_2_ = unpacked_endpoints.m_capacity._2_2_ + 1) {
    puVar6 = vector<unsigned_int>::operator[]
                       ((vector<unsigned_int> *)local_38,(uint)unpacked_endpoints.m_capacity._2_2_);
    if (local_58 < *puVar6) {
      puVar6 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)local_38,(uint)unpacked_endpoints.m_capacity._2_2_
                         );
      local_58 = *puVar6;
      i_1 = unpacked_endpoints.m_capacity._2_2_;
    }
  }
  vector<crnlib::optimize_color_params::unpacked_endpoint>::vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)local_70,uVar3 & 0xffff);
  for (local_72 = 0; local_72 < uVar2; local_72 = local_72 + 1) {
    if ((this->m_has_etc_color_blocks & 1U) == 0) {
      puVar6 = vector<unsigned_int>::operator[](&this->m_color_endpoints,(uint)local_72);
      dxt1_block::unpack_color((dxt1_block *)&local_78.field_0,(uint16)*puVar6,true,0xff);
      local_1d4 = local_78;
    }
    else {
      puVar6 = vector<unsigned_int>::operator[](&this->m_color_endpoints,(uint)local_72);
      local_1d4.m_u32 = *puVar6 & 0xffffff;
    }
    puVar7 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)local_70,
                        (uint)local_72);
    (puVar7->low).field_0.m_u32 = (uint32)local_1d4;
    if ((this->m_has_etc_color_blocks & 1U) == 0) {
      puVar6 = vector<unsigned_int>::operator[](&this->m_color_endpoints,(uint)local_72);
      dxt1_block::unpack_color
                ((dxt1_block *)&local_7c.field_0,*(uint16 *)((long)puVar6 + 2),true,0xff);
      local_1fc = local_7c;
    }
    else {
      puVar6 = vector<unsigned_int>::operator[](&this->m_color_endpoints,(uint)local_72);
      local_1fc.m_u32 = *puVar6 >> 0x18;
    }
    puVar7 = vector<crnlib::optimize_color_params::unpacked_endpoint>::operator[]
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)local_70,
                        (uint)local_72);
    (puVar7->high).field_0.m_u32 = (uint32)local_1fc;
  }
  local_220 = (result *)(weights + 2);
  do {
    optimize_color_params::result::result(local_220);
    local_220 = local_220 + 1;
  } while (local_220 != (result *)&remapping_trial[3].total_bits);
  _fStack_138 = 0;
  weights[0] = 0.16666667;
  weights[1] = 0.5;
  for (pParams._4_4_ = 0; pParams._4_4_ < 4; pParams._4_4_ = pParams._4_4_ + 1) {
    poVar8 = crnlib_new<crnlib::optimize_color_params>();
    puVar7 = vector<crnlib::optimize_color_params::unpacked_endpoint>::get_ptr
                       ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)local_70);
    poVar8->unpacked_endpoints = puVar7;
    puVar6 = vector<unsigned_int>::get_ptr((vector<unsigned_int> *)&sum.m_size);
    poVar8->hist = puVar6;
    poVar8->n = uVar2;
    poVar8->selected = i_1;
    poVar8->weight = *(float *)((long)remapping_trial + (ulong)pParams._4_4_ * 4 + -0x18);
    poVar8->pResult = (result *)&remapping_trial[(ulong)pParams._4_4_ - 1].total_bits;
    task_pool::
    queue_object_task<crnlib::crn_comp,void(crnlib::crn_comp::*)(unsigned_long_long,void*)>
              (&this->m_task_pool,this,0x1b3f10,0,(void *)(ulong)pParams._4_4_);
  }
  task_pool::join(&this->m_task_pool);
  local_15c = 0xffffffff;
  for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
    if (remapping_trial[local_160].packed_endpoints.m_size < local_15c) {
      vector<unsigned_char>::swap
                (&this->m_packed_color_endpoints,
                 (vector<unsigned_char> *)&remapping_trial[local_160].endpoint_remapping.m_size);
      vector<unsigned_short>::swap
                (this->m_endpoint_remaping,
                 (vector<unsigned_short> *)&remapping_trial[(ulong)local_160 - 1].total_bits);
      local_15c = remapping_trial[local_160].packed_endpoints.m_size;
    }
  }
  local_278 = (result *)&remapping_trial[3].total_bits;
  do {
    local_278 = local_278 + -1;
    optimize_color_params::result::~result(local_278);
  } while (local_278 != (result *)(weights + 2));
  vector<crnlib::optimize_color_params::unpacked_endpoint>::~vector
            ((vector<crnlib::optimize_color_params::unpacked_endpoint> *)local_70);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_38);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)&sum.m_size);
  return;
}

Assistant:

void crn_comp::optimize_color()
    {
        uint16 n = m_color_endpoints.size();
        crnlib::vector<uint> hist(n * n);
        crnlib::vector<uint> sum(n);
        for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i)
        {
            i = m_endpoint_indices[b].color;
            if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev)
            {
                hist[i * n + i_prev]++;
                hist[i_prev * n + i]++;
                sum[i]++;
                sum[i_prev]++;
            }
        }
        uint16 selected = 0;
        uint best_sum = 0;
        for (uint16 i = 0; i < n; i++)
        {
            if (best_sum < sum[i])
            {
                best_sum = sum[i];
                selected = i;
            }
        }
        crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
        for (uint16 i = 0; i < n; i++)
        {
            unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
            unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
        }

        optimize_color_params::result remapping_trial[4];
        float weights[4] = { 0, 0, 1.0f / 6.0f, 0.5f };
        for (uint i = 0; i < 4; i++)
        {
            optimize_color_params* pParams = crnlib_new<optimize_color_params>();
            pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
            pParams->hist = hist.get_ptr();
            pParams->n = n;
            pParams->selected = selected;
            pParams->weight = weights[i];
            pParams->pResult = remapping_trial + i;
            m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
        }
        m_task_pool.join();

        for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++)
        {
            if (remapping_trial[i].total_bits < best_bits)
            {
                m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
                m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
                best_bits = remapping_trial[i].total_bits;
            }
        }
    }